

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O0

void VFilter16i_SSE2(uint8_t *p,int stride,int thresh,int ithresh,int hev_thresh)

{
  __m128i *palVar1;
  __m128i *palVar2;
  longlong lVar3;
  __m128i *palVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  longlong *plVar16;
  undefined8 *puVar17;
  int in_ECX;
  undefined4 in_EDX;
  int in_ESI;
  __m128i *in_RDI;
  undefined1 auVar18 [16];
  uint8_t *b;
  __m128i tmp2;
  __m128i tmp1;
  __m128i mask;
  __m128i p0;
  __m128i p1;
  __m128i p2;
  __m128i p3;
  int k;
  longlong lVar19;
  __m128i *q1;
  __m128i *q0;
  __m128i *p0_00;
  __m128i *p1_00;
  longlong lStack_3d0;
  longlong local_3c8;
  longlong lStack_3c0;
  int local_3b4;
  __m128i *q0_00;
  __m128i *p0_01;
  __m128i *p1_01;
  
  local_3c8 = (*in_RDI)[0];
  lStack_3c0 = (*in_RDI)[1];
  puVar17 = (undefined8 *)((long)*in_RDI + (long)in_ESI);
  p1_00 = (__m128i *)*puVar17;
  lStack_3d0 = puVar17[1];
  puVar17 = (undefined8 *)((long)*in_RDI + (long)(in_ESI << 1));
  plVar16 = (longlong *)((long)*in_RDI + (long)(in_ESI * 3));
  lVar19 = *plVar16;
  q1 = (__m128i *)plVar16[1];
  q0 = (__m128i *)*puVar17;
  p0_00 = (__m128i *)puVar17[1];
  for (local_3b4 = 3; 0 < local_3b4; local_3b4 = local_3b4 + -1) {
    puVar17 = (undefined8 *)((long)*in_RDI + (long)(in_ESI << 1));
    in_RDI = (__m128i *)((long)*in_RDI + (long)(in_ESI << 2));
    auVar15._8_8_ = q1;
    auVar15._0_8_ = lVar19;
    auVar14._8_8_ = p0_00;
    auVar14._0_8_ = q0;
    psubusb(auVar15,auVar14);
    auVar13._8_8_ = p0_00;
    auVar13._0_8_ = q0;
    auVar12._8_8_ = q1;
    auVar12._0_8_ = lVar19;
    psubusb(auVar13,auVar12);
    auVar11._8_8_ = lStack_3d0;
    auVar11._0_8_ = p1_00;
    auVar10._8_8_ = lStack_3c0;
    auVar10._0_8_ = local_3c8;
    psubusb(auVar11,auVar10);
    auVar9._8_8_ = lStack_3c0;
    auVar9._0_8_ = local_3c8;
    auVar8._8_8_ = lStack_3d0;
    auVar8._0_8_ = p1_00;
    psubusb(auVar9,auVar8);
    auVar7._8_8_ = p0_00;
    auVar7._0_8_ = q0;
    auVar6._8_8_ = lStack_3d0;
    auVar6._0_8_ = p1_00;
    psubusb(auVar7,auVar6);
    auVar5._8_8_ = lStack_3d0;
    auVar5._0_8_ = p1_00;
    auVar18._8_8_ = p0_00;
    auVar18._0_8_ = q0;
    psubusb(auVar5,auVar18);
    local_3c8 = (*in_RDI)[0];
    lStack_3c0 = (*in_RDI)[1];
    p1_01 = (__m128i *)((long)*in_RDI + (long)in_ESI);
    p1_00 = (__m128i *)(*p1_01)[0];
    lStack_3d0 = (*p1_01)[1];
    p0_01 = (__m128i *)((long)*in_RDI + (long)(in_ESI << 1));
    palVar1 = (__m128i *)(*p0_01)[0];
    palVar2 = (__m128i *)(*p0_01)[1];
    q0_00 = (__m128i *)((long)*in_RDI + (long)(in_ESI * 3));
    lVar3 = (*q0_00)[0];
    palVar4 = (__m128i *)(*q0_00)[1];
    psubusb((undefined1  [16])*q0_00,(undefined1  [16])*p0_01);
    psubusb((undefined1  [16])*p0_01,(undefined1  [16])*q0_00);
    auVar18 = psubusb((undefined1  [16])*p1_01,(undefined1  [16])*in_RDI);
    psubusb((undefined1  [16])*in_RDI,(undefined1  [16])*p1_01);
    psubusb((undefined1  [16])*p0_01,(undefined1  [16])*p1_01);
    psubusb((undefined1  [16])*p1_01,(undefined1  [16])*p0_01);
    ComplexMask_SSE2(p1_00,p0_00,q0,q1,(int)((ulong)lVar19 >> 0x20),(int)lVar19,auVar18._8_8_);
    DoFilter4_SSE2(p1_01,p0_01,q0_00,in_RDI,(__m128i *)CONCAT44(in_ESI,in_EDX),in_ECX);
    *puVar17 = q0;
    puVar17[1] = p0_00;
    *(longlong *)((long)puVar17 + (long)in_ESI) = lVar19;
    ((longlong *)((long)puVar17 + (long)in_ESI))[1] = (longlong)q1;
    plVar16 = (longlong *)((long)puVar17 + (long)(in_ESI << 1));
    *plVar16 = local_3c8;
    plVar16[1] = lStack_3c0;
    puVar17 = (undefined8 *)((long)puVar17 + (long)(in_ESI * 3));
    *puVar17 = p1_00;
    puVar17[1] = lStack_3d0;
    lVar19 = lVar3;
    q1 = palVar4;
    q0 = palVar1;
    p0_00 = palVar2;
  }
  return;
}

Assistant:

static void VFilter16i_SSE2(uint8_t* p, int stride,
                            int thresh, int ithresh, int hev_thresh) {
  int k;
  __m128i p3, p2, p1, p0;   // loop invariants

  LOAD_H_EDGES4(p, stride, p3, p2, p1, p0);  // prologue

  for (k = 3; k > 0; --k) {
    __m128i mask, tmp1, tmp2;
    uint8_t* const b = p + 2 * stride;   // beginning of p1
    p += 4 * stride;

    MAX_DIFF1(p3, p2, p1, p0, mask);   // compute partial mask
    LOAD_H_EDGES4(p, stride, p3, p2, tmp1, tmp2);
    MAX_DIFF2(p3, p2, tmp1, tmp2, mask);

    // p3 and p2 are not just temporary variables here: they will be
    // re-used for next span. And q2/q3 will become p1/p0 accordingly.
    ComplexMask_SSE2(&p1, &p0, &p3, &p2, thresh, ithresh, &mask);
    DoFilter4_SSE2(&p1, &p0, &p3, &p2, &mask, hev_thresh);

    // Store
    _mm_storeu_si128((__m128i*)&b[0 * stride], p1);
    _mm_storeu_si128((__m128i*)&b[1 * stride], p0);
    _mm_storeu_si128((__m128i*)&b[2 * stride], p3);
    _mm_storeu_si128((__m128i*)&b[3 * stride], p2);

    // rotate samples
    p1 = tmp1;
    p0 = tmp2;
  }
}